

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitAssignmentToFuncName
               (ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfoParent
               )

{
  ushort uVar1;
  FuncInfo *pFVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ParseNodeVar *pPVar6;
  FunctionBody *pFVar7;
  FuncInfo *pFVar8;
  Symbol *this;
  RegSlot RVar9;
  
  pPVar6 = pnodeFnc->pnodeName;
  if ((pPVar6->super_ParseNode).nop != knopVarDecl) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x48d,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                       "pnodeFnc->pnodeName->nop == knopVarDecl");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    pPVar6 = pnodeFnc->pnodeName;
  }
  this = pPVar6->sym;
  if (this == (Symbol *)0x0) {
    return;
  }
  uVar1 = *(ushort *)&this->field_0x42;
  if ((uVar1 & 0x20) != 0) {
    return;
  }
  if ((uVar1 >> 0xe & 1) == 0) {
    if ((uVar1 & 8) == 0) {
      bVar4 = Symbol::NeedsSlotAlloc(this,byteCodeGenerator,funcInfoParent);
      if (bVar4) {
        uVar1 = *(ushort *)&this->field_0x42;
        if ((uVar1 >> 0xb & 1) != 0) {
          pFVar7 = FuncInfo::GetParsedFunctionBody(funcInfoParent);
          if (((pFVar7->super_ParseableFunctionInfo).flags & Flags_StackNestedFunc) == Flags_None)
          goto LAB_007fefc6;
          uVar1 = *(ushort *)&this->field_0x42;
        }
        *(ushort *)&this->field_0x42 = uVar1 | 0x400;
      }
LAB_007fefc6:
      pFVar2 = this->scope->func;
      pFVar8 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
      RVar9 = (pnodeFnc->super_ParseNode).location;
      if (pFVar2 == pFVar8) {
        ByteCodeGenerator::EmitLocalPropInit(byteCodeGenerator,RVar9,this,funcInfoParent);
      }
      else {
        ByteCodeGenerator::EmitPropStore
                  (byteCodeGenerator,RVar9,this,(IdentPtr)0x0,funcInfoParent,false,false,false,false
                  );
      }
      this = Symbol::GetFuncScopeVarSym(this);
      if (this == (Symbol *)0x0) {
        return;
      }
      if (((this->field_0x42 & 8) != 0) && ((byteCodeGenerator->flags & 0x400) != 0)) {
        ByteCodeGenerator::EmitGlobalFncDeclInit
                  (byteCodeGenerator,(pnodeFnc->super_ParseNode).location,this->position,
                   funcInfoParent);
        return;
      }
      RVar9 = (pnodeFnc->super_ParseNode).location;
      bVar4 = true;
      goto LAB_007ff045;
    }
    ByteCodeGenerator::EmitGlobalFncDeclInit
              (byteCodeGenerator,(pnodeFnc->super_ParseNode).location,this->position,funcInfoParent)
    ;
    if ((byteCodeGenerator->flags & 0x400) == 0) {
      return;
    }
    if (((funcInfoParent->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0) {
      return;
    }
  }
  RVar9 = (pnodeFnc->super_ParseNode).location;
  bVar4 = false;
LAB_007ff045:
  ByteCodeGenerator::EmitPropStore
            (byteCodeGenerator,RVar9,this,(IdentPtr)0x0,funcInfoParent,false,false,bVar4,false);
  return;
}

Assistant:

void EmitAssignmentToFuncName(ParseNodeFnc *pnodeFnc, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfoParent)
{
    // Assign the location holding the func object reference to the given name.
    Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
    Symbol *sym = pnodeFnc->pnodeName->sym;

    if (sym != nullptr && !sym->GetIsFuncExpr())
    {
        if (sym->GetIsModuleExportStorage())
        {
            byteCodeGenerator->EmitPropStore(pnodeFnc->location, sym, nullptr, funcInfoParent);
        }
        else if (sym->GetIsGlobal())
        {
            Js::PropertyId propertyId = sym->GetPosition();
            byteCodeGenerator->EmitGlobalFncDeclInit(pnodeFnc->location, propertyId, funcInfoParent);
            if (byteCodeGenerator->GetFlags() & fscrEval && !funcInfoParent->GetIsStrictMode())
            {
                byteCodeGenerator->EmitPropStore(pnodeFnc->location, sym, nullptr, funcInfoParent);
            }
        }
        else
        {
            if (sym->NeedsSlotAlloc(byteCodeGenerator, funcInfoParent))
            {
                if (!sym->GetHasNonCommittedReference() ||
                    (funcInfoParent->GetParsedFunctionBody()->DoStackNestedFunc()))
                {
                    // No point in trying to optimize if there are no references before we have to commit to slot.
                    // And not safe to delay putting a stack function in the slot, since we may miss boxing.
                    sym->SetIsCommittedToSlot();
                }
            }

            if (sym->GetScope()->GetFunc() != byteCodeGenerator->TopFuncInfo())
            {
                byteCodeGenerator->EmitPropStore(pnodeFnc->location, sym, nullptr, funcInfoParent);
            }
            else
            {
                byteCodeGenerator->EmitLocalPropInit(pnodeFnc->location, sym, funcInfoParent);
            }

            Symbol * fncScopeSym = sym->GetFuncScopeVarSym();

            if (fncScopeSym)
            {
                if (fncScopeSym->GetIsGlobal() && byteCodeGenerator->GetFlags() & fscrEval)
                {
                    Js::PropertyId propertyId = fncScopeSym->GetPosition();
                    byteCodeGenerator->EmitGlobalFncDeclInit(pnodeFnc->location, propertyId, funcInfoParent);
                }
                else
                {
                    byteCodeGenerator->EmitPropStore(pnodeFnc->location, fncScopeSym, nullptr, funcInfoParent, false, false, /* isFncDeclVar */true);
                }
            }
        }
    }
}